

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

int disas_neon_insn_2reg_scalar_ext(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  ARMISARegisters *pAVar1;
  bool bVar2;
  sbyte sVar3;
  uint uVar4;
  TCGv_ptr ptr;
  sbyte sVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint32_t oprsz;
  uint32_t uVar9;
  code *fn;
  code *fn_00;
  uint unaff_R13D;
  uint uVar10;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar7 = insn & 0x40;
  uVar9 = insn;
  if ((insn & 0xff000f10) == 0xfe000800) {
    pAVar1 = s->isar;
    if (pAVar1->id_isar5 < 0x10000000) {
LAB_0064c03f:
      bVar2 = false;
      fn_00 = (code *)0x0;
    }
    else {
      if ((insn >> 0x17 & 1) == 0) {
        if ((pAVar1->id_aa64pfr0 & 0xf0000) != 0x10000) goto LAB_0064c03f;
        uVar9 = insn & 0xf;
        uVar4 = insn >> 3 & 4;
        fn_00 = gen_helper_gvec_fcmlah_idx;
      }
      else {
        if ((pAVar1->mvfr0 & 0xe) == 0) {
          if ((insn & 0x20) != 0) goto LAB_0064c03f;
          uVar9 = insn & 0xf;
        }
        else {
          uVar9 = insn >> 1 & 0x10 | insn & 0xf;
        }
        uVar4 = 0;
        fn_00 = gen_helper_gvec_fcmlas_idx;
      }
      unaff_R13D = insn >> 0x14 & 3 | uVar4;
      bVar2 = true;
    }
    if (!bVar2) {
      return 1;
    }
    bVar8 = 0;
  }
  else {
    if ((insn & 0xffb00f00) == 0xfe200d00) {
      uVar4 = s->isar->id_isar6;
      if ((uVar4 & 0xf0) == 0) {
        fn = (gen_helper_gvec_3_conflict1 *)0x0;
      }
      else {
        fn = gen_helper_gvec_udot_idx_b;
        if ((insn & 0x10) == 0) {
          fn = gen_helper_gvec_sdot_idx_b;
        }
        unaff_R13D = insn >> 5 & 1;
        uVar9 = insn & 0xf;
      }
      if ((uVar4 & 0xf0) == 0) {
        return 1;
      }
      bVar8 = 0;
      fn_00 = (code *)0x0;
      goto LAB_0064c13b;
    }
    if ((insn & 0xffa00f10) != 0xfe000810) {
      return 1;
    }
    uVar4 = s->isar->id_isar6;
    if ((uVar4 & 0xf00) == 0) {
      bVar8 = 0;
      fn_00 = (code *)0x0;
    }
    else {
      uVar6 = insn >> 5 & 1;
      uVar9 = insn & 7;
      uVar10 = uVar6 * 2;
      if (uVar7 == 0) {
        uVar10 = 0;
        uVar9 = uVar6 + uVar9 * 2;
      }
      unaff_R13D = (insn >> 0x14 & 1) + (uVar10 | insn >> 3 & 1) * 4;
      fn_00 = gen_helper_gvec_fmlal_idx_a32;
      bVar8 = 1;
    }
    if ((uVar4 & 0xf00) == 0) {
      return 1;
    }
  }
  fn = (gen_helper_gvec_3_conflict1 *)0x0;
LAB_0064c13b:
  uVar4 = s->isar->mvfr0;
  if ((uVar4 & 0xe) == 0) {
    if ((insn >> 0x16 & 1) != 0) {
      return 1;
    }
    uVar10 = insn >> 0xc & 0xf;
  }
  else {
    uVar10 = insn >> 0x12 & 0x10 | insn >> 0xc & 0xf;
  }
  if ((uVar10 & uVar7 >> 6) != 0) {
    return 1;
  }
  if ((uVar7 == 0) && (bVar8 != 0)) {
    uVar4 = (insn >> 9 & 0x700) + (insn >> 7 & 1 | insn >> 0xf & 2) * 4;
    uVar6 = 0xc;
    sVar3 = 2;
    sVar5 = 6;
  }
  else {
    if ((uVar4 & 0xe) == 0) {
      if ((char)insn < '\0') {
        return 1;
      }
      uVar4 = insn >> 0x10 & 0xf;
    }
    else {
      uVar4 = insn >> 3 & 0x10 | insn >> 0x10 & 0xf;
    }
    if ((uVar7 >> 6 & (uint)(byte)~bVar8 & uVar4) != 0) {
      return 1;
    }
    uVar4 = (uVar4 << 3 | uVar4 << 7) & 0xf08;
    uVar6 = 8;
    sVar3 = 3;
    sVar5 = 7;
  }
  if (s->fp_excp_el == 0) {
    if (s->vfp_enabled != true) {
      return 1;
    }
    uVar9 = (uVar9 << sVar5 & 0xffffff00) + (uVar9 << sVar3 & uVar6) + 0xc10;
    oprsz = (uint)(uVar7 != 0) * 8 + 8;
    if (fn_00 != (code *)0x0) {
      if (bVar8 == 0) {
        ptr = get_fpstatus_ptr_aarch64(tcg_ctx,1);
      }
      else {
        ptr = tcg_ctx->cpu_env;
      }
      tcg_gen_gvec_3_ptr_aarch64
                (tcg_ctx,((uVar10 << 3 | uVar10 << 7) & 0xf08) + 0xc10,uVar4 + 0xc10,uVar9,ptr,oprsz
                 ,oprsz,unaff_R13D,fn_00);
      if (bVar8 != 0) {
        return 0;
      }
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ptr + (long)tcg_ctx));
      return 0;
    }
    tcg_gen_gvec_3_ool_aarch64
              (tcg_ctx,((uVar10 << 3 | uVar10 << 7) & 0xf08) + 0xc10,uVar4 + 0xc10,uVar9,oprsz,oprsz
               ,unaff_R13D,fn);
  }
  else {
    gen_exception_insn(s,(uint32_t)s->pc_curr,1,0x1fe00020,s->fp_excp_el);
  }
  return 0;
}

Assistant:

static int disas_neon_insn_2reg_scalar_ext(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_helper_gvec_3 *fn_gvec = NULL;
    gen_helper_gvec_3_ptr *fn_gvec_ptr = NULL;
    int rd, rn, rm, opr_sz, data;
    int off_rn, off_rm;
    bool is_long = false, q = extract32(insn, 6, 1);
    bool ptr_is_env = false;

    if ((insn & 0xff000f10) == 0xfe000800) {
        /* VCMLA (indexed) -- 1111 1110 S.RR .... .... 1000 ...0 .... */
        int rot = extract32(insn, 20, 2);
        int size = extract32(insn, 23, 1);
        int index;

        if (!dc_isar_feature(aa32_vcma, s)) {
            return 1;
        }
        if (size == 0) {
            if (!dc_isar_feature(aa32_fp16_arith, s)) {
                return 1;
            }
            /* For fp16, rm is just Vm, and index is M.  */
            rm = extract32(insn, 0, 4);
            index = extract32(insn, 5, 1);
        } else {
            /* For fp32, rm is the usual M:Vm, and index is 0.  */
            VFP_DREG_M(rm, insn);
            index = 0;
        }
        data = (index << 2) | rot;
        fn_gvec_ptr = (size ? gen_helper_gvec_fcmlas_idx
                       : gen_helper_gvec_fcmlah_idx);
    } else if ((insn & 0xffb00f00) == 0xfe200d00) {
        /* V[US]DOT -- 1111 1110 0.10 .... .... 1101 .Q.U .... */
        int u = extract32(insn, 4, 1);

        if (!dc_isar_feature(aa32_dp, s)) {
            return 1;
        }
        fn_gvec = u ? gen_helper_gvec_udot_idx_b : gen_helper_gvec_sdot_idx_b;
        /* rm is just Vm, and index is M.  */
        data = extract32(insn, 5, 1); /* index */
        rm = extract32(insn, 0, 4);
    } else if ((insn & 0xffa00f10) == 0xfe000810) {
        /* VFM[AS]L -- 1111 1110 0.0S .... .... 1000 .Q.1 .... */
        int is_s = extract32(insn, 20, 1);
        int vm20 = extract32(insn, 0, 3);
        int vm3 = extract32(insn, 3, 1);
        int m = extract32(insn, 5, 1);
        int index;

        if (!dc_isar_feature(aa32_fhm, s)) {
            return 1;
        }
        if (q) {
            rm = vm20;
            index = m * 2 + vm3;
        } else {
            rm = vm20 * 2 + m;
            index = vm3;
        }
        is_long = true;
        data = (index << 2) | is_s; /* is_2 == 0 */
        fn_gvec_ptr = gen_helper_gvec_fmlal_idx_a32;
        ptr_is_env = true;
    } else {
        return 1;
    }

    VFP_DREG_D(rd, insn);
    if (rd & q) {
        return 1;
    }
    if (q || !is_long) {
        VFP_DREG_N(rn, insn);
        if (rn & q & !is_long) {
            return 1;
        }
        off_rn = vfp_reg_offset(1, rn);
        off_rm = vfp_reg_offset(1, rm);
    } else {
        rn = VFP_SREG_N(insn);
        off_rn = vfp_reg_offset(0, rn);
        off_rm = vfp_reg_offset(0, rm);
    }
    if (s->fp_excp_el) {
        gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                           syn_simd_access_trap(1, 0xe, false), s->fp_excp_el);
        return 0;
    }
    if (!s->vfp_enabled) {
        return 1;
    }

    opr_sz = (1 + q) * 8;
    if (fn_gvec_ptr) {
        TCGv_ptr ptr;
        if (ptr_is_env) {
            ptr = tcg_ctx->cpu_env;
        } else {
            ptr = get_fpstatus_ptr(tcg_ctx, 1);
        }
        tcg_gen_gvec_3_ptr(tcg_ctx, vfp_reg_offset(1, rd), off_rn, off_rm, ptr,
                           opr_sz, opr_sz, data, fn_gvec_ptr);
        if (!ptr_is_env) {
            tcg_temp_free_ptr(tcg_ctx, ptr);
        }
    } else {
        tcg_gen_gvec_3_ool(tcg_ctx, vfp_reg_offset(1, rd), off_rn, off_rm,
                           opr_sz, opr_sz, data, fn_gvec);
    }
    return 0;
}